

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

char * vrna_cpu_vendor_string(void)

{
  long lVar1;
  
  lVar1 = cpuid_basic_info(0);
  vrna_cpu_vendor_string::name._0_4_ = *(undefined4 *)(lVar1 + 4);
  vrna_cpu_vendor_string::name._4_4_ = *(undefined4 *)(lVar1 + 8);
  vrna_cpu_vendor_string::name._8_4_ = *(undefined4 *)(lVar1 + 0xc);
  vrna_cpu_vendor_string::name[0xc] = '\0';
  return vrna_cpu_vendor_string::name;
}

Assistant:

PUBLIC char *
vrna_cpu_vendor_string(void)
{
  static char name[13] = {
    0
  };
  uint32_t    regs[4] = {
    0
  };

  if (execute_cpuid(&regs[0])) {
    memcpy(name + 0, &regs[1], 4);
    memcpy(name + 4, &regs[3], 4);
    memcpy(name + 8, &regs[2], 4);
    name[12] = '\0';
  }

  return name;
}